

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::RecordTargetProgress
          (cmGlobalUnixMakefileGenerator3 *this,cmMakefileTargetGenerator *tg)

{
  pointer pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  cmGeneratorTarget *local_38 [2];
  cmTarget *local_28;
  
  local_38[0] = (tg->super_cmCommonTargetGenerator).GeneratorTarget;
  pmVar3 = std::
           map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
           ::operator[](&this->ProgressMap,local_38);
  iVar2 = (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[5])(tg);
  pmVar3->NumberOfActions = CONCAT44(extraout_var,iVar2);
  pcVar1 = (tg->ProgressFileNameFull)._M_dataplus._M_p;
  local_38[0] = (key_type)&stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (tg->ProgressFileNameFull)._M_string_length);
  std::__cxx11::string::operator=((string *)&pmVar3->VariableFile,(string *)local_38);
  if (local_38[0] != (key_type)&stack0xffffffffffffffd8) {
    operator_delete(local_38[0],
                    (ulong)&(local_28->Properties).
                            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                            ._M_t._M_impl.field_0x1);
  }
  return;
}

Assistant:

void
cmGlobalUnixMakefileGenerator3::RecordTargetProgress(
  cmMakefileTargetGenerator* tg)
{
  TargetProgress& tp = this->ProgressMap[tg->GetGeneratorTarget()];
  tp.NumberOfActions = tg->GetNumberOfProgressActions();
  tp.VariableFile = tg->GetProgressFileNameFull();
}